

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O1

DUH * dumb_read_riff_am(DUMBFILE *f,riff *stream)

{
  riff_chunk *prVar1;
  riff *prVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  char cVar7;
  uchar uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int32 iVar14;
  DUMB_IT_SIGDATA *sigdata_00;
  IT_PATTERN *pIVar15;
  IT_SAMPLE *pIVar16;
  uchar *puVar17;
  riff *prVar18;
  DUH *pDVar19;
  uchar uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *local_68;
  DUMB_IT_SIGDATA *local_60;
  char *local_58;
  DUMB_IT_SIGDATA *local_50;
  char *local_48;
  char *local_40;
  
  local_68 = &_dumb_sigtype_it;
  if (((stream != (riff *)0x0 && f != (DUMBFILE *)0x0) && (stream->type == 0x414d2020)) &&
     (sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138), sigdata_00 != (DUMB_IT_SIGDATA *)0x0)) {
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    if (stream->chunk_count != 0) {
      uVar23 = 0;
      uVar12 = 0;
      do {
        prVar1 = stream->chunks + uVar23;
        uVar10 = prVar1->type;
        if ((int)uVar10 < 0x50415454) {
          if (uVar10 == 0x494e4954) {
            iVar11 = 7;
            if (((uVar12 & 1) != 0) || (prVar1->size < 0x48)) goto LAB_005aeff6;
            uVar12 = uVar12 | 1;
          }
          else if (uVar10 == 0x4f524452) {
            iVar11 = 7;
            if (((uVar12 & 2) != 0) || (prVar1->size == 0)) goto LAB_005aeff6;
            uVar12 = uVar12 | 2;
          }
LAB_005aeff3:
          iVar11 = 0;
        }
        else {
          if (uVar10 != 0x50415454) {
            if (uVar10 == 0x52494646) {
              prVar2 = prVar1->nested;
              if ((prVar2->type == 0x41492020) && (prVar2->chunk_count != 0)) {
                uVar24 = 0;
                do {
                  prVar1 = prVar2->chunks;
                  if (prVar1[uVar24].type == 0x494e5354) {
                    iVar9 = dumbfile_seek(f,(long)prVar1[uVar24].offset,0);
                    iVar11 = 7;
                    if ((iVar9 == 0) && (uVar10 = dumbfile_igetl(f), 0x141 < uVar10)) {
                      dumbfile_skip(f,1);
                      iVar9 = dumbfile_getc(f);
                      if (sigdata_00->n_samples <= iVar9) {
                        sigdata_00->n_samples = iVar9 + 1;
                      }
                      prVar18 = riff_parse(f,uVar10 + prVar1[uVar24].offset + 4,
                                           (prVar1[uVar24].size - uVar10) + -4,1);
                      iVar11 = 0;
                      bVar4 = true;
                      bVar3 = true;
                      if (prVar18 != (riff *)0x0) {
                        bVar3 = bVar4;
                        if ((prVar18->type == 0x41532020) && ((ulong)prVar18->chunk_count != 0)) {
                          lVar22 = 0;
                          bVar4 = false;
                          do {
                            bVar6 = bVar4;
                            if ((*(int *)((long)&prVar18->chunks->type + lVar22) == 0x53414d50) &&
                               (bVar6 = true, bVar4)) {
                              iVar11 = 7;
                              bVar3 = false;
                              goto LAB_005aef70;
                            }
                            bVar4 = bVar6;
                            lVar22 = lVar22 + 0x18;
                          } while ((ulong)prVar18->chunk_count * 0x18 != lVar22);
                          iVar11 = 0;
                        }
LAB_005aef70:
                        riff_free(prVar18);
                      }
                    }
                    else {
                      bVar3 = false;
                    }
                    if (bVar3) goto LAB_005aeeb4;
                  }
                  else {
LAB_005aeeb4:
                    iVar11 = 0;
                  }
                  if (iVar11 != 0) goto LAB_005aefe9;
                  uVar24 = uVar24 + 1;
                } while (uVar24 < prVar2->chunk_count);
              }
              iVar11 = 0;
LAB_005aefe9:
              if (iVar11 != 0) goto LAB_005aeff6;
            }
            goto LAB_005aeff3;
          }
          iVar9 = dumbfile_seek(f,(long)prVar1->offset,0);
          iVar11 = 7;
          if (iVar9 == 0) {
            iVar9 = dumbfile_getc(f);
            if (sigdata_00->n_patterns <= iVar9) {
              sigdata_00->n_patterns = iVar9 + 1;
            }
            iVar14 = dumbfile_igetl(f);
            if (iVar14 + 5U <= prVar1->size) goto LAB_005aeff3;
          }
        }
LAB_005aeff6:
        if (iVar11 != 0) {
          if (iVar11 != 7) goto LAB_005af651;
          goto LAB_005af646;
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < stream->chunk_count);
      if ((((uVar12 == 3) && (sigdata_00->n_samples != 0)) && (sigdata_00->n_patterns < 0x100)) &&
         ((sigdata_00->n_samples < 0x100 && (sigdata_00->n_patterns != 0)))) {
        sigdata_00->song_message = (uchar *)0x0;
        sigdata_00->n_orders = 0;
        sigdata_00->n_instruments = 0;
        sigdata_00->order = (uchar *)0x0;
        sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
        sigdata_00->sample = (IT_SAMPLE *)0x0;
        sigdata_00->pattern = (IT_PATTERN *)0x0;
        sigdata_00->midi = (IT_MIDI *)0x0;
        sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
        sigdata_00->mixing_volume = 0x30;
        sigdata_00->pan_separation = 0x80;
        sigdata_00->restart_position = '\0';
        builtin_memcpy(sigdata_00->channel_volume,
                       "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
        cVar7 = (char)(uint)((ulong)((long)(dumb_it_default_panning_separation << 5) * 0x51eb851f)
                            >> 0x25) - (char)((dumb_it_default_panning_separation << 5) >> 0x1f);
        uVar20 = ' ' - cVar7;
        uVar8 = cVar7 + ' ';
        uVar23 = 0xfffffffffffffffc;
        do {
          sigdata_00->channel_pan[uVar23 + 4] = uVar20;
          sigdata_00->channel_pan[uVar23 + 5] = uVar8;
          sigdata_00->channel_pan[uVar23 + 6] = uVar8;
          sigdata_00->channel_pan[uVar23 + 7] = uVar20;
          uVar23 = uVar23 + 4;
        } while (uVar23 < 0x3c);
        if (stream->chunk_count != 0) {
          uVar23 = 0;
          do {
            prVar1 = stream->chunks;
            iVar9 = 0;
            if (prVar1[uVar23].type == 0x494e4954) {
              iVar11 = dumbfile_seek(f,(long)prVar1[uVar23].offset,0);
              iVar9 = 0x17;
              if (iVar11 == 0) {
                dumbfile_getnc((char *)sigdata_00,0x40,f);
                sigdata_00->name[0x40] = '\0';
                sigdata_00->flags = 0x131;
                uVar12 = dumbfile_getc(f);
                if ((uVar12 & 1) == 0) {
                  *(byte *)&sigdata_00->flags = (byte)sigdata_00->flags | 8;
                }
                if ((uVar12 & 0xfffffffe) == 2) {
                  iVar11 = dumbfile_getc(f);
                  sigdata_00->n_pchannels = iVar11;
                  iVar11 = dumbfile_getc(f);
                  sigdata_00->speed = iVar11;
                  iVar11 = dumbfile_getc(f);
                  sigdata_00->tempo = iVar11;
                  dumbfile_skip(f,4);
                  iVar11 = dumbfile_getc(f);
                  sigdata_00->global_volume = iVar11;
                  if ((sigdata_00->n_pchannels + 0x48U <= prVar1[uVar23].size) &&
                     (iVar9 = 0, 0 < sigdata_00->n_pchannels)) {
                    lVar22 = 0;
                    do {
                      iVar11 = dumbfile_getc(f);
                      uVar8 = (uchar)((uint)(iVar11 - (iVar11 >> 0x1f)) >> 1);
                      iVar9 = 0;
                      puVar17 = sigdata_00->channel_pan;
                      if (0x80 < iVar11) {
                        uVar8 = '\0';
                        puVar17 = sigdata_00->channel_volume;
                      }
                      puVar17[lVar22] = uVar8;
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < sigdata_00->n_pchannels);
                  }
                }
              }
            }
            if (iVar9 != 0) {
              if (iVar9 != 0x17) goto LAB_005af651;
              goto LAB_005af6ba;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 < stream->chunk_count);
        }
        iVar9 = sigdata_00->n_patterns;
        pIVar15 = (IT_PATTERN *)malloc((long)iVar9 << 4);
        sigdata_00->pattern = pIVar15;
        auVar5 = _DAT_005d8eb0;
        if (pIVar15 != (IT_PATTERN *)0x0) {
          if (0 < iVar9) {
            lVar22 = (long)iVar9 + -1;
            auVar26._8_4_ = (int)lVar22;
            auVar26._0_8_ = lVar22;
            auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
            lVar22 = 0;
            auVar26 = auVar26 ^ _DAT_005d8eb0;
            auVar27 = _DAT_00632e10;
            do {
              auVar28 = auVar27 ^ auVar5;
              if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                          auVar26._4_4_ < auVar28._4_4_) & 1)) {
                *(undefined8 *)((long)&pIVar15->entry + lVar22) = 0;
              }
              if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
                  auVar28._12_4_ <= auVar26._12_4_) {
                *(undefined8 *)((long)&pIVar15[1].entry + lVar22) = 0;
              }
              lVar21 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 2;
              auVar27._8_8_ = lVar21 + 2;
              lVar22 = lVar22 + 0x20;
            } while ((ulong)(iVar9 + 1U >> 1) << 5 != lVar22);
          }
          iVar9 = sigdata_00->n_samples;
          pIVar16 = (IT_SAMPLE *)malloc((long)iVar9 * 0x68);
          sigdata_00->sample = pIVar16;
          if (pIVar16 != (IT_SAMPLE *)0x0) {
            if (0 < iVar9) {
              lVar22 = 0;
              lVar21 = 0;
              do {
                pIVar16 = sigdata_00->sample;
                puVar17 = pIVar16->filename + lVar22 + 0x35;
                puVar17[0] = '\0';
                puVar17[1] = '\0';
                puVar17[2] = '\0';
                puVar17[3] = '\0';
                puVar17[4] = '\0';
                puVar17[5] = '\0';
                puVar17[6] = '\0';
                puVar17[7] = '\0';
                pIVar16->filename[lVar22 + 0xf] = '\0';
                pIVar16->name[lVar22] = '\0';
                lVar21 = lVar21 + 1;
                lVar22 = lVar22 + 0x68;
              } while (lVar21 < sigdata_00->n_samples);
            }
            if (stream->chunk_count != 0) {
              uVar23 = 0;
              do {
                prVar1 = stream->chunks + uVar23;
                uVar12 = prVar1->type;
                if (uVar12 == 0x52494646) {
                  prVar2 = prVar1->nested;
                  if ((prVar2->type == 0x41492020) && (prVar2->chunk_count != 0)) {
                    uVar24 = 0;
                    do {
                      prVar1 = prVar2->chunks;
                      if (prVar1[uVar24].type == 0x494e5354) {
                        iVar11 = dumbfile_seek(f,(long)prVar1[uVar24].offset,0);
                        iVar9 = 0x17;
                        if (iVar11 == 0) {
                          iVar14 = dumbfile_igetl(f);
                          dumbfile_skip(f,1);
                          iVar11 = dumbfile_getc(f);
                          prVar18 = riff_parse(f,iVar14 + prVar1[uVar24].offset + 4,
                                               (prVar1[uVar24].size - iVar14) + -4,1);
                          pIVar16 = sigdata_00->sample;
                          if (prVar18 != (riff *)0x0) {
                            if ((prVar18->type == 0x41532020) && (prVar18->chunk_count != 0)) {
                              lVar22 = 0;
                              uVar25 = 0;
                              do {
                                if (*(int *)((long)&prVar18->chunks->type + lVar22) == 0x53414d50) {
                                  riff_free(prVar18);
                                  iVar9 = 0x17;
                                  goto LAB_005af5da;
                                }
                                uVar25 = uVar25 + 1;
                                lVar22 = lVar22 + 0x18;
                              } while (uVar25 < prVar18->chunk_count);
                            }
                            riff_free(prVar18);
                          }
                          iVar9 = 0;
                          dumbfile_seek(f,(long)prVar1[uVar24].offset + 6,0);
                          dumbfile_getnc((char *)(pIVar16 + iVar11),0x20,f);
                          pIVar16[iVar11].name[0x20] = '\0';
                        }
LAB_005af5da:
                        if (iVar9 == 0) goto LAB_005af5ee;
                      }
                      else {
LAB_005af5ee:
                        iVar9 = 0;
                      }
                      iVar11 = iVar9;
                      if (iVar9 != 0) goto joined_r0x005af60b;
                      uVar24 = uVar24 + 1;
                    } while (uVar24 < prVar2->chunk_count);
                  }
                  iVar9 = 0;
                  iVar11 = iVar9;
joined_r0x005af60b:
                  if (iVar11 == 0) {
LAB_005af60d:
                    iVar9 = 0;
                  }
                }
                else if (uVar12 == 0x50415454) {
                  iVar11 = dumbfile_seek(f,(long)prVar1->offset,0);
                  iVar9 = 0x17;
                  if (iVar11 == 0) {
                    iVar11 = dumbfile_getc(f);
                    iVar14 = dumbfile_igetl(f);
                    iVar11 = it_riff_am_process_pattern(sigdata_00->pattern + iVar11,f,iVar14,1);
                    goto joined_r0x005af60b;
                  }
                }
                else {
                  if (uVar12 != 0x4f524452) goto LAB_005af60d;
                  iVar11 = dumbfile_seek(f,(long)prVar1->offset,0);
                  iVar9 = 0x17;
                  if (iVar11 == 0) {
                    iVar13 = dumbfile_getc(f);
                    iVar11 = iVar13 + 1;
                    sigdata_00->n_orders = iVar11;
                    if (iVar13 + 2U <= prVar1->size) {
                      puVar17 = (uchar *)malloc((long)iVar11);
                      sigdata_00->order = puVar17;
                      if (puVar17 != (uchar *)0x0) {
                        dumbfile_getnc((char *)puVar17,iVar11,f);
                        goto LAB_005af60d;
                      }
                    }
                  }
                }
                if (iVar9 != 0) {
                  if (iVar9 == 0x17) goto LAB_005af6ba;
                  goto LAB_005af651;
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 < stream->chunk_count);
            }
            _dumb_it_fix_invalid_orders(sigdata_00);
            goto LAB_005af651;
          }
        }
LAB_005af6ba:
        _dumb_it_unload_sigdata(sigdata_00);
        goto LAB_005af64e;
      }
    }
LAB_005af646:
    free(sigdata_00);
  }
LAB_005af64e:
  sigdata_00 = (DUMB_IT_SIGDATA *)0x0;
LAB_005af651:
  if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
    pDVar19 = (DUH *)0x0;
  }
  else {
    local_58 = "TITLE";
    local_48 = "FORMAT";
    local_40 = "RIFF AM";
    local_60 = sigdata_00;
    local_50 = sigdata_00;
    pDVar19 = make_duh(-1,2,(char *(*) [2])&local_58,1,&local_68,&local_60);
  }
  return pDVar19;
}

Assistant:

DUH *dumb_read_riff_am( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_am_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AM";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}